

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimeline.cpp
# Opt level: O0

void __thiscall QTimeLine::setPaused(QTimeLine *this,bool paused)

{
  parameter_type pVar1;
  QTimeLinePrivate *pQVar2;
  byte in_SIL;
  QTimeLinePrivate *in_RDI;
  long in_FS_OFFSET;
  QTimeLinePrivate *d;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>
  *this_00;
  QBasicTimer *in_stack_ffffffffffffff98;
  Duration duration;
  QMessageLogger local_28;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QTimeLine *)0x71f033);
  if (pQVar2->state == NotRunning) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff98,line,
               (char *)in_stack_ffffffffffffff88);
    QMessageLogger::warning(&local_28,"QTimeLine::setPaused: Not running");
  }
  else if (((in_SIL & 1) == 0) || (pQVar2->state == Paused)) {
    if (((in_SIL & 1) == 0) && (pQVar2->state == Paused)) {
      duration.__r = (rep)&pQVar2->basicTimer;
      this_00 = &pQVar2->updateInterval;
      ms<(char)49>();
      std::chrono::
      operator*<QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>,_long,_std::ratio<1L,_1000L>_>
                ((QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>
                  *)in_stack_ffffffffffffff88,(duration<long,_std::ratio<1L,_1000L>_> *)0x71f11f);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)this_00,in_stack_ffffffffffffff88);
      QBasicTimer::start((QBasicTimer *)in_stack_ffffffffffffff88,duration,(QObject *)0x71f147);
      pVar1 = ::QObjectCompatProperty::operator_cast_to_int
                        ((QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
                          *)0x71f158);
      pQVar2->startTime = pVar1;
      QElapsedTimer::start((QElapsedTimer *)duration.__r);
      QTimeLinePrivate::setState(in_RDI,(State)((ulong)duration.__r >> 0x20));
    }
  }
  else {
    pVar1 = ::QObjectCompatProperty::operator_cast_to_int
                      ((QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
                        *)0x71f097);
    pQVar2->startTime = pVar1;
    QBasicTimer::stop(in_stack_ffffffffffffff98);
    QTimeLinePrivate::setState(in_RDI,(State)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTimeLine::setPaused(bool paused)
{
    Q_D(QTimeLine);
    if (d->state == NotRunning) {
        qWarning("QTimeLine::setPaused: Not running");
        return;
    }
    if (paused && d->state != Paused) {
        d->startTime = d->currentTime;
        d->basicTimer.stop();
        d->setState(Paused);
    } else if (!paused && d->state == Paused) {
        // Same as resume()
        d->basicTimer.start(d->updateInterval * 1ms, this);
        d->startTime = d->currentTime;
        d->timer.start();
        d->setState(Running);
    }
}